

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_option.hpp
# Opt level: O2

void __thiscall Catch::Option<Catch::GroupInfo>::reset(Option<Catch::GroupInfo> *this)

{
  if (this->nullableValue != (GroupInfo *)0x0) {
    std::__cxx11::string::~string((string *)this->nullableValue);
  }
  this->nullableValue = (GroupInfo *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = CATCH_NULL;
        }